

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.cpp
# Opt level: O3

JoinSide duckdb::JoinSide::CombineJoinSide(JoinSide left,JoinSide right)

{
  bool bVar1;
  
  if (left.value != NONE) {
    if (right.value == NONE) {
      return (JoinSide)left.value;
    }
    bVar1 = left.value == right.value;
    right.value = BOTH;
    if (bVar1) {
      right.value = left.value;
    }
  }
  return (JoinSide)right.value;
}

Assistant:

JoinSide JoinSide::CombineJoinSide(JoinSide left, JoinSide right) {
	if (left == JoinSide::NONE) {
		return right;
	}
	if (right == JoinSide::NONE) {
		return left;
	}
	if (left != right) {
		return JoinSide::BOTH;
	}
	return left;
}